

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Spinner.H
# Opt level: O0

void __thiscall Fl_Spinner::update(Fl_Spinner *this)

{
  bool bVar1;
  char **local_170;
  char *sp;
  char temp [64];
  uint local_11c;
  char local_118 [4];
  int c;
  char s [255];
  Fl_Spinner *this_local;
  
  if (((*this->format_ == '%') && (this->format_[1] == '.')) && (this->format_[2] == '*')) {
    local_11c = 0;
    sprintf((char *)&sp,"%.12f",this->step_);
    for (local_170 = &sp; *(char *)local_170 != '\0'; local_170 = (char **)((long)local_170 + 1)) {
    }
    do {
      local_170 = (char **)((long)local_170 + -1);
      bVar1 = false;
      if (&sp < local_170) {
        bVar1 = *(char *)local_170 == '0';
      }
    } while (bVar1);
    while( true ) {
      bVar1 = false;
      if ((&sp < local_170) && (bVar1 = false, '/' < *(char *)local_170)) {
        bVar1 = *(char *)local_170 < ':';
      }
      if (!bVar1) break;
      local_170 = (char **)((long)local_170 + -1);
      local_11c = local_11c + 1;
    }
    sprintf(local_118,this->format_,this->value_,(ulong)local_11c);
  }
  else {
    sprintf(local_118,this->format_,this->value_);
  }
  Fl_Input_::value(&(this->input_).super_Fl_Input_,local_118);
  return;
}

Assistant:

void		update() {
		  char s[255];		// Value string

		  if (format_[0]=='%'&&format_[1]=='.'&&format_[2]=='*') {  // precision argument
		    // this code block is a simplified version of
		    // Fl_Valuator::format() and works well (but looks ugly)
		    int c = 0;
		    char temp[64], *sp = temp;
		    sprintf(temp, "%.12f", step_);
		    while (*sp) sp++;
		    sp--;
		    while (sp>temp && *sp=='0') sp--;
		    while (sp>temp && (*sp>='0' && *sp<='9')) { sp--; c++; }
		    sprintf(s, format_, c, value_);
		  } else {
		    sprintf(s, format_, value_);
		  }
		  input_.value(s);
		}